

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O2

void __thiscall UnitTest_parser7::Run(UnitTest_parser7 *this)

{
  bool bVar1;
  allocator local_39;
  long *local_38;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"t.a.b.c = 1",&local_39);
  anon_unknown.dwarf_6bcd::Parse((anon_unknown_dwarf_6bcd *)&local_38,&local_30);
  if (local_38 == (long *)0x0) {
    local_38 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string
              ((string *)&local_30,"\'Parse(\"t.a.b.c = 1\")\'",(allocator *)&local_38);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_30);
  }
  else {
    (**(code **)(*local_38 + 8))();
    local_38 = (long *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = anon_unknown.dwarf_6bcd::IsEOF();
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_30,"\'IsEOF()\'",(allocator *)&local_38);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

TEST_CASE(parser7)
{
    EXPECT_TRUE(Parse("t.a.b.c = 1"));
    EXPECT_TRUE(IsEOF());
}